

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

HeapThunk * __thiscall
jsonnet::internal::anon_unknown_0::Stack::lookUpVar(Stack *this,Identifier *id)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  pointer ppVar4;
  long in_RDI;
  const_iterator it;
  BindingFrame *binds;
  int i;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_38;
  _Self local_30;
  BindingFrame *local_28;
  int local_1c;
  
  sVar2 = std::
          vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ::size((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                  *)(in_RDI + 0x10));
  local_1c = (int)sVar2;
  while( true ) {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return (HeapThunk *)0x0;
    }
    pvVar3 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                           *)(in_RDI + 0x10),(long)local_1c);
    local_28 = &pvVar3->bindings;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         ::find(in_stack_ffffffffffffffb8,(key_type *)0x2417f1);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (bVar1) break;
    pvVar3 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                           *)(in_RDI + 0x10),(long)local_1c);
    bVar1 = Frame::isCall(pvVar3);
    if (bVar1) {
      return (HeapThunk *)0x0;
    }
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                         *)0x241824);
  return ppVar4->second;
}

Assistant:

HeapThunk *lookUpVar(const Identifier *id)
    {
        for (int i = stack.size() - 1; i >= 0; --i) {
            const auto &binds = stack[i].bindings;
            auto it = binds.find(id);
            if (it != binds.end()) {
                return it->second;
            }
            if (stack[i].isCall())
                break;
        }
        return nullptr;
    }